

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_ctx_check_module(lys_module *module)

{
  ly_ctx *ctx_00;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  lys_revision *local_78;
  lys_revision *local_60;
  lys_revision *local_50;
  lys_revision *local_38;
  char *last_rev;
  int local_28;
  int to_implement;
  int match_i;
  int i;
  ly_ctx *ctx;
  lys_module *module_local;
  
  local_28 = -1;
  local_38 = (lys_revision *)0x0;
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xdd1,"int lyp_ctx_check_module(struct lys_module *)");
  }
  bVar1 = 0;
  ctx_00 = module->ctx;
  for (to_implement = 0; to_implement < (int)(uint)module->rev_size; to_implement = to_implement + 1
      ) {
    if ((local_38 == (lys_revision *)0x0) ||
       (iVar3 = strcmp(local_38->date,module->rev[to_implement].date), iVar3 < 0)) {
      local_38 = module->rev + to_implement;
    }
  }
  to_implement = 0;
  do {
    if ((ctx_00->models).used <= to_implement) {
      if (bVar1 == 0) {
        module_local._4_4_ = 0;
      }
      else {
        iVar3 = lys_set_implemented((ctx_00->models).list[local_28]);
        if (iVar3 == 0) {
          module_local._4_4_ = 1;
        }
        else {
          module_local._4_4_ = -1;
        }
      }
      return module_local._4_4_;
    }
    iVar3 = strcmp((ctx_00->models).list[to_implement]->name,module->name);
    if (iVar3 == 0) {
      if (bVar1 == 0) {
        if (((ctx_00->models).list[to_implement]->rev_size == '\0') && (module->rev_size != '\0')) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Module \"%s\" without revision already in context.",
                 module->name);
          return -1;
        }
        if (((ctx_00->models).list[to_implement]->rev_size != '\0') && (module->rev_size == '\0')) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Module \"%s\" with revision \"%s\" already in context.",
                 module->name,(ctx_00->models).list[to_implement]->rev);
          return -1;
        }
        if (((module->rev_size == '\0') && ((ctx_00->models).list[to_implement]->rev_size == '\0'))
           || (iVar3 = strcmp((ctx_00->models).list[to_implement]->rev->date,local_38->date),
              iVar3 == 0)) {
          if (local_38 == (lys_revision *)0x0) {
            local_60 = (lys_revision *)0x1f073f;
          }
          else {
            local_60 = local_38;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s@%s\" already in context.",
                 module->name,local_60);
          if ((*(ushort *)&(ctx_00->models).list[to_implement]->field_0x40 >> 6 & 1) != 0) {
            lys_set_enabled((ctx_00->models).list[to_implement]);
          }
          uVar2 = *(ushort *)&module->field_0x40 >> 7;
          bVar1 = (byte)uVar2 & 1;
          local_28 = to_implement;
          if (((uVar2 & 1) == 0) ||
             ((*(ushort *)&(ctx_00->models).list[to_implement]->field_0x40 >> 7 & 1) != 0)) {
            return 1;
          }
          to_implement = -1;
        }
        else if (((*(ushort *)&module->field_0x40 >> 7 & 1) != 0) &&
                ((*(ushort *)&(ctx_00->models).list[to_implement]->field_0x40 >> 7 & 1) != 0)) {
          if (local_38 == (lys_revision *)0x0) {
            local_78 = (lys_revision *)0x1f073f;
          }
          else {
            local_78 = local_38;
          }
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                 "Module \"%s@%s\" in another revision \"%s\" already implemented.",module->name,
                 local_78,(ctx_00->models).list[to_implement]->rev);
          return -1;
        }
      }
      else if (to_implement != local_28) {
        if (local_38 == (lys_revision *)0x0) {
          local_50 = (lys_revision *)0x1f073f;
        }
        else {
          local_50 = local_38;
        }
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,
               "Module \"%s@%s\" in another revision \"%s\" already implemented.",module->name,
               local_50,(ctx_00->models).list[to_implement]->rev);
        return -1;
      }
    }
    else {
      iVar3 = strcmp((ctx_00->models).list[to_implement]->ns,module->ns);
      if (iVar3 == 0) {
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,
               "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
               (ctx_00->models).list[to_implement]->name,module->name,module->ns);
        return -1;
      }
    }
    to_implement = to_implement + 1;
  } while( true );
}

Assistant:

int
lyp_ctx_check_module(struct lys_module *module)
{
    struct ly_ctx *ctx;
    int i, match_i = -1, to_implement;
    const char *last_rev = NULL;

    assert(module);
    to_implement = 0;
    ctx = module->ctx;

    /* find latest revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (!last_rev || (strcmp(last_rev, module->rev[i].date) < 0)) {
            last_rev = module->rev[i].date;
        }
    }

    for (i = 0; i < ctx->models.used; i++) {
        /* check name (name/revision) and namespace uniqueness */
        if (!strcmp(ctx->models.list[i]->name, module->name)) {
            if (to_implement) {
                if (i == match_i) {
                    continue;
                }
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            } else if (!ctx->models.list[i]->rev_size && module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" without revision already in context.", module->name);
                return -1;
            } else if (ctx->models.list[i]->rev_size && !module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" with revision \"%s\" already in context.",
                       module->name, ctx->models.list[i]->rev[0].date);
                return -1;
            } else if ((!module->rev_size && !ctx->models.list[i]->rev_size)
                    || !strcmp(ctx->models.list[i]->rev[0].date, last_rev)) {

                LOGVRB("Module \"%s@%s\" already in context.", module->name, last_rev ? last_rev : "<latest>");

                /* if disabled, enable first */
                if (ctx->models.list[i]->disabled) {
                    lys_set_enabled(ctx->models.list[i]);
                }

                to_implement = module->implemented;
                match_i = i;
                if (to_implement && !ctx->models.list[i]->implemented) {
                    /* check first that it is okay to change it to implemented */
                    i = -1;
                    continue;
                }
                return 1;

            } else if (module->implemented && ctx->models.list[i]->implemented) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            }
            /* else keep searching, for now the caller is just adding
             * another revision of an already present schema
             */
        } else if (!strcmp(ctx->models.list[i]->ns, module->ns)) {
            LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                   ctx->models.list[i]->name, module->name, module->ns);
            return -1;
        }
    }

    if (to_implement) {
        if (lys_set_implemented(ctx->models.list[match_i])) {
            return -1;
        }
        return 1;
    }

    return 0;
}